

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O0

void __thiscall xmrig::OclCnRunner::~OclCnRunner(OclCnRunner *this)

{
  void *in_RDI;
  
  ~OclCnRunner(this);
  operator_delete(in_RDI);
  return;
}

Assistant:

xmrig::OclCnRunner::~OclCnRunner()
{
    delete m_cn1;
    delete m_cn2;

    OclLib::release(m_scratchpads);
    OclLib::release(m_states);

    for (size_t i = 0; i < BRANCH_MAX; ++i) {
        delete m_branchKernels[i];
        OclLib::release(m_branches[i]);
    }
}